

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poolresourcetester.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
PoolResourceTester::FreeListSizes<8ul,8ul>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          PoolResourceTester *this,PoolResource<8UL,_8UL> *resource)

{
  size_t sVar1;
  undefined8 *puVar2;
  size_t sVar3;
  long lVar4;
  long in_FS_OFFSET;
  size_t size;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar4 = 0x20; lVar4 != 0x30; lVar4 = lVar4 + 8) {
    puVar2 = *(undefined8 **)(this + lVar4);
    size = 0;
    sVar1 = 1;
    for (; sVar3 = sVar1, puVar2 != (undefined8 *)0x0; puVar2 = (undefined8 *)*puVar2) {
      sVar1 = sVar3 + 1;
      size = sVar3;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (__return_storage_ptr__,&size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<std::size_t> FreeListSizes(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES>& resource)
    {
        auto sizes = std::vector<std::size_t>();
        for (const auto* ptr : resource.m_free_lists) {
            size_t size = 0;
            while (ptr != nullptr) {
                ++size;
                ptr = ptr->m_next;
            }
            sizes.push_back(size);
        }
        return sizes;
    }